

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioVoice_SetVolume(FAudioVoice *voice,float Volume,uint32_t OperationSet)

{
  uint32_t sendIndex;
  float fVar1;
  
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    FAudio_PlatformLockMutex(voice->sendLock);
    FAudio_PlatformLockMutex(voice->volumeLock);
    fVar1 = -16777216.0;
    if (-16777216.0 <= Volume) {
      fVar1 = Volume;
    }
    voice->volume =
         (float)(-(uint)(16777216.0 < Volume) & 0x4b800000 |
                ~-(uint)(16777216.0 < Volume) & (uint)fVar1);
    if ((voice->sends).SendCount != 0) {
      sendIndex = 0;
      do {
        FAudio_RecalcMixMatrix(voice,sendIndex);
        sendIndex = sendIndex + 1;
      } while (sendIndex < (voice->sends).SendCount);
    }
    FAudio_PlatformUnlockMutex(voice->volumeLock);
    FAudio_PlatformUnlockMutex(voice->sendLock);
  }
  else {
    FAudio_OPERATIONSET_QueueSetVolume(voice,Volume,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetVolume(
	FAudioVoice *voice,
	float Volume,
	uint32_t OperationSet
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetVolume(
			voice,
			Volume,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	voice->volume = FAudio_clamp(
		Volume,
		-FAUDIO_MAX_VOLUME_LEVEL,
		FAUDIO_MAX_VOLUME_LEVEL
	);

	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		FAudio_RecalcMixMatrix(voice, i);
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

	LOG_API_EXIT(voice->audio)
	return 0;
}